

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_Parser.cpp
# Opt level: O0

void __thiscall
psy::C::Parser::DiagnosticsReporter::ExpectedTokenOfCategory
          (DiagnosticsReporter *this,Category category,string *id)

{
  SyntaxToken *this_00;
  string local_1c0 [39];
  allocator<char> local_199;
  string local_198 [32];
  string local_178 [32];
  DiagnosticDescriptor local_158;
  string local_f0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string s;
  string *id_local;
  Category category_local;
  DiagnosticsReporter *this_local;
  
  s.field_2._8_8_ = id;
  to_string_abi_cxx11_(&local_c0,(C *)(ulong)category,(Category)id);
  std::operator+(&local_a0,"expected ",&local_c0);
  std::operator+(&local_80,&local_a0," got `");
  this_00 = peek(this->parser_,1);
  SyntaxToken::valueText_abi_cxx11_(&local_f0,this_00);
  std::operator+(&local_60,&local_80,&local_f0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &local_60,"\'");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string(local_178,(string *)s.field_2._8_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_198,"[[expected token of category]]",&local_199);
  std::__cxx11::string::string(local_1c0,(string *)local_40);
  psy::DiagnosticDescriptor::DiagnosticDescriptor(&local_158,local_178,local_198,local_1c0,2,1);
  diagnoseOrDelayDiagnostic(this,&local_158);
  DiagnosticDescriptor::~DiagnosticDescriptor(&local_158);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator(&local_199);
  std::__cxx11::string::~string(local_178);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void Parser::DiagnosticsReporter::ExpectedTokenOfCategory(SyntaxToken::Category category,
                                                          const std::string& id)
{
    std::string s = "expected "
            + to_string(category)
            + " got `"
            + parser_->peek().valueText() + "'";

    diagnoseOrDelayDiagnostic(
                DiagnosticDescriptor(id,
                                     "[[expected token of category]]",
                                     s,
                                     DiagnosticSeverity::Error,
                                     DiagnosticCategory::Syntax));
}